

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O1

void __thiscall coins_tests::coins_resource_is_used::test_method(coins_resource_is_used *this)

{
  ulong uVar1;
  size_t i;
  long lVar2;
  allocator_type *__a;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  double dVar5;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  size_t usage_before;
  CCoinsMap map;
  COutPoint out_point;
  CCoinsMapMemoryResource resource;
  check_type cVar6;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 local_218 [16];
  shared_count local_208;
  char **local_200;
  assertion_result local_1f8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  unsigned_long local_1c0;
  char *local_1b8;
  char *local_1b0;
  binary_expr<boost::test_tools::assertion::value_expr<const_unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  local_1a8;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_178;
  undefined1 local_128 [16];
  undefined8 local_118;
  binary_expr<boost::test_tools::assertion::value_expr<const_unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  *pbStack_110;
  uint32_t local_108;
  PoolResource<144UL,_8UL> local_100;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  PoolResource<144UL,_8UL>::PoolResource(&local_100,0x40000);
  PoolResourceTester::CheckAllDataAccountedFor<144ul,8ul>(&local_100);
  SaltedOutpointHasher::SaltedOutpointHasher((SaltedOutpointHasher *)local_128,false);
  __a = (allocator_type *)local_218;
  local_218._0_8_ = &local_100;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_178,0,(SaltedOutpointHasher *)local_128,(key_equal *)&local_1f8,__a);
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x456;
  file.m_begin = (iterator)&local_188;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)__a;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_198,msg);
  lVar2 = 0x30;
  if (*(size_t *)
       local_178.
       super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>_>
       .
       super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>,_false>
       ._M_tp.m_resource != 0) {
    lVar2 = (*(size_t *)
              local_178.
              super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>_>
              .
              super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>,_false>
              ._M_tp.m_resource + 0x1f & 0xfffffffffffffff0) + 0x30;
  }
  uVar1 = local_178._M_bucket_count * 8 + 0x1f & 0xfffffffffffffff0;
  if ((local_178._M_bucket_count & 0x1fffffffffffffff) == 0) {
    uVar1 = 0;
  }
  local_1f8._0_8_ =
       uVar1 + lVar2 * (((list<std::byte_*,_std::allocator<std::byte_*>_> *)
                        ((long)local_178.
                               super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>_>
                               .
                               super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>,_false>
                               ._M_tp.m_resource + 8))->
                       super__List_base<std::byte_*,_std::allocator<std::byte_*>_>)._M_impl._M_node.
                       _M_size;
  local_1f8.m_message.px = (element_type *)local_100.m_chunk_size_bytes;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::GE<unsigned_long,_unsigned_long,_void>_>
  ::evaluate((assertion_result *)local_218,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::GE<unsigned_long,_unsigned_long,_void>_>
              *)&local_1f8,false);
  pbStack_110 = &local_1a8;
  local_1a8.m_lhs.m_value = (unsigned_long *)0xe6cdc7;
  local_1a8.m_rhs = 0xe6cdff;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013abc70;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_1b0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_218,(lazy_ostream *)local_128,1,0xe,WARN,_cVar6,
             (size_t)&local_1b8,0x456);
  boost::detail::shared_count::~shared_count(&local_208);
  dVar5 = ceil(1000.0 / (double)local_178._M_rehash_policy._M_max_load_factor);
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&local_178,(long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5);
  lVar2 = 0x30;
  if (*(long *)local_178.
               super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>_>
               .
               super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>,_false>
               ._M_tp.m_resource != 0) {
    lVar2 = (*(long *)local_178.
                      super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>_>
                      .
                      super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>,_false>
                      ._M_tp.m_resource + 0x1fU & 0xfffffffffffffff0) + 0x30;
  }
  uVar1 = local_178._M_bucket_count * 8 + 0x1f & 0xfffffffffffffff0;
  if ((local_178._M_bucket_count & 0x1fffffffffffffff) == 0) {
    uVar1 = 0;
  }
  local_1c0 = uVar1 + lVar2 * *(size_t *)
                               ((long)local_178.
                                      super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>_>
                                      .
                                      super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>,_false>
                                      ._M_tp.m_resource + 0x18);
  local_118._0_1_ = '\0';
  local_118._1_1_ = '\0';
  local_118._2_1_ = '\0';
  local_118._3_1_ = '\0';
  local_118._4_1_ = '\0';
  local_118._5_1_ = '\0';
  local_118._6_1_ = '\0';
  local_118._7_1_ = '\0';
  pbStack_110 = (binary_expr<boost::test_tools::assertion::value_expr<const_unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
                 *)0x0;
  local_128._0_8_ = (_func_int **)0x0;
  local_128._8_8_ = 0;
  lVar2 = 0;
  do {
    local_108 = (uint32_t)lVar2;
    std::__detail::
    _Map_base<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&local_178,(key_type *)local_128);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 1000);
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x462;
  file_00.m_begin = (iterator)&local_1d0;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1e0,
             msg_00);
  lVar2 = 0x30;
  if (*(size_t *)
       local_178.
       super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>_>
       .
       super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>,_false>
       ._M_tp.m_resource != 0) {
    lVar2 = (*(size_t *)
              local_178.
              super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>_>
              .
              super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>,_false>
              ._M_tp.m_resource + 0x1f & 0xfffffffffffffff0) + 0x30;
  }
  uVar1 = local_178._M_bucket_count * 8 + 0x1f & 0xfffffffffffffff0;
  if ((local_178._M_bucket_count & 0x1fffffffffffffff) == 0) {
    uVar1 = 0;
  }
  local_1a8.m_rhs =
       uVar1 + lVar2 * (((list<std::byte_*,_std::allocator<std::byte_*>_> *)
                        ((long)local_178.
                               super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>_>
                               .
                               super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>,_false>
                               ._M_tp.m_resource + 8))->
                       super__List_base<std::byte_*,_std::allocator<std::byte_*>_>)._M_impl._M_node.
                       _M_size;
  local_1a8.m_lhs.m_value = &local_1c0;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<const_unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_1f8,&local_1a8,false);
  local_200 = &local_228;
  local_228 = "usage_before == memusage::DynamicUsage(map)";
  local_220 = "";
  local_218[8] = false;
  local_218._0_8_ = &PTR__lazy_ostream_013abc70;
  local_208.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_230 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_1f8,(lazy_ostream *)local_218,1,0xe,WARN,_cVar6,(size_t)&local_238,0x462);
  boost::detail::shared_count::~shared_count(&local_1f8.m_message.pn);
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_178);
  PoolResourceTester::CheckAllDataAccountedFor<144ul,8ul>(&local_100);
  PoolResource<144UL,_8UL>::~PoolResource(&local_100);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(coins_resource_is_used)
{
    CCoinsMapMemoryResource resource;
    PoolResourceTester::CheckAllDataAccountedFor(resource);

    {
        CCoinsMap map{0, CCoinsMap::hasher{}, CCoinsMap::key_equal{}, &resource};
        BOOST_TEST(memusage::DynamicUsage(map) >= resource.ChunkSizeBytes());

        map.reserve(1000);

        // The resource has preallocated a chunk, so we should have space for at several nodes without the need to allocate anything else.
        const auto usage_before = memusage::DynamicUsage(map);

        COutPoint out_point{};
        for (size_t i = 0; i < 1000; ++i) {
            out_point.n = i;
            map[out_point];
        }
        BOOST_TEST(usage_before == memusage::DynamicUsage(map));
    }

    PoolResourceTester::CheckAllDataAccountedFor(resource);
}